

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# yssimplesound.cpp
# Opt level: O2

YSRESULT __thiscall YsSoundPlayer::SoundData::ConvertToStereo(SoundData *this)

{
  uchar uVar1;
  uchar uVar2;
  uint uVar3;
  uchar *puVar4;
  int i;
  uchar *puVar5;
  ulong uVar6;
  int i_1;
  uint uVar7;
  
  if (this->stereo != YSTRUE) {
    if (this->bit == 0x10) {
      uVar3 = this->sizeInBytes;
      uVar7 = uVar3 * 2;
      puVar5 = (uchar *)operator_new__((ulong)uVar7);
      puVar4 = this->dat;
      for (uVar6 = 0; uVar6 < uVar3; uVar6 = uVar6 + 2) {
        uVar1 = puVar4[uVar6];
        puVar5[uVar6 * 2] = uVar1;
        uVar2 = puVar4[uVar6 + 1];
        puVar5[uVar6 * 2 + 1] = uVar2;
        puVar5[uVar6 * 2 + 2] = uVar1;
        puVar5[uVar6 * 2 + 3] = uVar2;
      }
      this->dat = puVar5;
    }
    else {
      if (this->bit != 8) {
        return YSERR;
      }
      uVar3 = this->sizeInBytes;
      uVar7 = uVar3 * 2;
      puVar5 = (uchar *)operator_new__((ulong)uVar7);
      puVar4 = this->dat;
      for (uVar6 = 0; uVar3 != uVar6; uVar6 = uVar6 + 1) {
        uVar1 = puVar4[uVar6];
        puVar5[uVar6 * 2] = uVar1;
        puVar5[uVar6 * 2 + 1] = uVar1;
      }
      if (puVar4 != (uchar *)0x0) {
        operator_delete__(puVar4);
        uVar7 = this->sizeInBytes * 2;
      }
      this->dat = puVar5;
    }
    this->stereo = YSTRUE;
    this->sizeInBytes = uVar7;
  }
  return YSOK;
}

Assistant:

YSRESULT YsSoundPlayer::SoundData::ConvertToStereo(void)
{
	if(stereo==YSTRUE)
	{
		return YSOK;
	}
	else
	{
		if(bit==8)
		{
			unsigned char *newDat=new unsigned char [sizeInBytes*2];
			for(int i=0; i<sizeInBytes; i++)
			{
				newDat[i*2  ]=dat[i];
				newDat[i*2+1]=dat[i];
			}
			delete [] dat;
			dat=newDat;
			stereo=YSTRUE;
			sizeInBytes*=2;
			return YSOK;
		}
		else if(bit==16)
		{
			unsigned char *newDat=new unsigned char [sizeInBytes*2];
			for(int i=0; i<sizeInBytes; i+=2)
			{
				newDat[i*2  ]=dat[i];
				newDat[i*2+1]=dat[i+1];
				newDat[i*2+2]=dat[i];
				newDat[i*2+3]=dat[i+1];
			}
			dat=newDat;
			stereo=YSTRUE;
			sizeInBytes*=2;
			return YSOK;
		}
	}
	return YSERR;
}